

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu383.c
# Opt level: O0

MPP_RET hal_h265d_vdpu383_start(void *hal,HalTaskInfo *task)

{
  MppBufSlots *local_68;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  RK_U32 i;
  RK_S32 index;
  HalH265dCtx *reg_ctx;
  Vdpu383H265dRegSet *hw_regs;
  RK_U8 *p;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  if ((((task->dec).flags.val >> 2 & 1) == 0) &&
     ((((task->dec).flags.val >> 3 & 1) == 0 || (*(int *)(*(long *)((long)hal + 0x18) + 0x30) != 0))
     )) {
    if (*(int *)((long)hal + 0x180) == 0) {
      hw_regs = *(Vdpu383H265dRegSet **)((long)hal + 0x100);
      reg_ctx = *(HalH265dCtx **)((long)hal + 0x100);
    }
    else {
      hw_regs = *(Vdpu383H265dRegSet **)((long)hal + (long)(task->dec).reg_index * 0x28 + 0x128);
      reg_ctx = *(HalH265dCtx **)((long)hal + (long)(task->dec).reg_index * 0x28 + 0x128);
    }
    if (reg_ctx == (HalH265dCtx *)0x0) {
      _mpp_log_l(2,"hal_h265d_vdpu383","hal_h265d_start hw_regs is NULL",(char *)0x0);
      hal_local._4_4_ = MPP_ERR_NULL_PTR;
    }
    else {
      for (wr_cfg.size = 0; wr_cfg.size < 0x44; wr_cfg.size = wr_cfg.size + 1) {
        if ((hal_h265d_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h265d_vdpu383","RK_HEVC_DEC: regs[%02d]=%08X\n",(char *)0x0,
                     (ulong)wr_cfg.size,(ulong)(uint)(hw_regs->reg_version).reg0);
        }
        hw_regs = (Vdpu383H265dRegSet *)&hw_regs->ctrl_regs;
      }
      rd_cfg._8_8_ = (long)&reg_ctx->api + 4;
      p._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,&rd_cfg.size);
      if (p._4_4_ == MPP_OK) {
        rd_cfg._8_8_ = &reg_ctx->rcb_buf_size;
        p._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,&rd_cfg.size);
        if (p._4_4_ == MPP_OK) {
          rd_cfg._8_8_ = reg_ctx->rcb_buf;
          p._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,&rd_cfg.size);
          if (p._4_4_ == MPP_OK) {
            rd_cfg._8_8_ = &reg_ctx->field_0x194;
            p._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,&rd_cfg.size);
            if (p._4_4_ == MPP_OK) {
              local_68 = &reg_ctx->slots;
              rd_cfg.reg._0_4_ = 4;
              rd_cfg.reg._4_4_ = 0x3c;
              p._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),5,&local_68);
              if (p._4_4_ == MPP_OK) {
                vdpu383_set_rcbinfo(*(MppDev *)((long)hal + 0x10),
                                    (Vdpu383RcbInfo *)((long)hal + 100));
                p._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0xf,(void *)0x0);
                if (p._4_4_ != MPP_OK) {
                  _mpp_log_l(2,"hal_h265d_vdpu383","send cmd failed %d\n","hal_h265d_vdpu383_start",
                             (ulong)(uint)p._4_4_);
                }
              }
              else {
                _mpp_log_l(2,"hal_h265d_vdpu383","set register read failed %d\n",
                           "hal_h265d_vdpu383_start",(ulong)(uint)p._4_4_);
              }
            }
            else {
              _mpp_log_l(2,"hal_h265d_vdpu383","set register write failed %d\n",
                         "hal_h265d_vdpu383_start",(ulong)(uint)p._4_4_);
            }
          }
          else {
            _mpp_log_l(2,"hal_h265d_vdpu383","set register write failed %d\n",
                       "hal_h265d_vdpu383_start",(ulong)(uint)p._4_4_);
          }
        }
        else {
          _mpp_log_l(2,"hal_h265d_vdpu383","set register write failed %d\n",
                     "hal_h265d_vdpu383_start",(ulong)(uint)p._4_4_);
        }
      }
      else {
        _mpp_log_l(2,"hal_h265d_vdpu383","set register read failed %d\n","hal_h265d_vdpu383_start",
                   (ulong)(uint)p._4_4_);
      }
      hal_local._4_4_ = p._4_4_;
    }
  }
  else {
    if ((hal_h265d_debug & 0x20) != 0) {
      _mpp_log_l(4,"hal_h265d_vdpu383","%s found task error\n",(char *)0x0,"hal_h265d_vdpu383_start"
                );
    }
    hal_local._4_4_ = MPP_OK;
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_h265d_vdpu383_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    RK_U8* p = NULL;
    Vdpu383H265dRegSet *hw_regs = NULL;
    HalH265dCtx *reg_ctx = (HalH265dCtx *)hal;
    RK_S32 index =  task->dec.reg_index;

    RK_U32 i;

    if (task->dec.flags.parse_err ||
        (task->dec.flags.ref_err && !reg_ctx->cfg->base.disable_error)) {
        h265h_dbg(H265H_DBG_TASK_ERR, "%s found task error\n", __FUNCTION__);
        return MPP_OK;
    }

    if (reg_ctx->fast_mode) {
        p = (RK_U8*)reg_ctx->g_buf[index].hw_regs;
        hw_regs = ( Vdpu383H265dRegSet *)reg_ctx->g_buf[index].hw_regs;
    } else {
        p = (RK_U8*)reg_ctx->hw_regs;
        hw_regs = ( Vdpu383H265dRegSet *)reg_ctx->hw_regs;
    }

    if (hw_regs == NULL) {
        mpp_err("hal_h265d_start hw_regs is NULL");
        return MPP_ERR_NULL_PTR;
    }
    for (i = 0; i < 68; i++) {
        h265h_dbg(H265H_DBG_REG, "RK_HEVC_DEC: regs[%02d]=%08X\n",
                  i, *((RK_U32*)p));
        //mpp_log("RK_HEVC_DEC: regs[%02d]=%08X\n", i, *((RK_U32*)p));
        p += 4;
    }

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &hw_regs->ctrl_regs;
        wr_cfg.size = sizeof(hw_regs->ctrl_regs);
        wr_cfg.offset = OFFSET_CTRL_REGS;
        ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->common_addr;
        wr_cfg.size = sizeof(hw_regs->common_addr);
        wr_cfg.offset = OFFSET_COMMON_ADDR_REGS;
        ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->h265d_paras;
        wr_cfg.size = sizeof(hw_regs->h265d_paras);
        wr_cfg.offset = OFFSET_CODEC_PARAS_REGS;
        ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->h265d_addrs;
        wr_cfg.size = sizeof(hw_regs->h265d_addrs);
        wr_cfg.offset = OFFSET_CODEC_ADDR_REGS;
        ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &hw_regs->ctrl_regs.reg15;
        rd_cfg.size = sizeof(hw_regs->ctrl_regs.reg15);
        rd_cfg.offset = OFFSET_INTERRUPT_REGS;
        ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        /* rcb info for sram */
        vdpu383_set_rcbinfo(reg_ctx->dev, (Vdpu383RcbInfo*)reg_ctx->rcb_info);

        ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    return ret;
}